

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph_color.hpp
# Opt level: O0

void __thiscall
optimization::graph_color::Conflict_Map::add_conflict
          (Conflict_Map *this,VarId *defVar,
          set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
          *useVars)

{
  bool bVar1;
  size_type sVar2;
  size_type sVar3;
  ostream *this_00;
  key_type *in_RDX;
  VarId *in_RSI;
  map<mir::inst::VarId,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>_>_>
  *in_RDI;
  VarId useVar;
  iterator __end2;
  iterator __begin2;
  set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_> *__range2;
  VarId *in_stack_fffffffffffffe58;
  VarId *in_stack_fffffffffffffe60;
  key_type *in_stack_fffffffffffffe68;
  mapped_type *in_stack_fffffffffffffe70;
  key_type *in_stack_fffffffffffffe78;
  mapped_type *in_stack_fffffffffffffe80;
  VarId local_e8;
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  VarId local_b0;
  _Self local_a0;
  _Self local_98 [2];
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  key_type local_48;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  undefined8 uStack_20;
  
  sVar2 = std::
          map<mir::inst::VarId,_mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_mir::inst::VarId>_>_>
          ::count((map<mir::inst::VarId,_mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_mir::inst::VarId>_>_>
                   *)in_stack_fffffffffffffe70,in_stack_fffffffffffffe68);
  if (sVar2 != 0) {
    std::
    map<mir::inst::VarId,_mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_mir::inst::VarId>_>_>
    ::at((map<mir::inst::VarId,_mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_mir::inst::VarId>_>_>
          *)in_stack_fffffffffffffe80,in_stack_fffffffffffffe78);
    mir::inst::VarId::operator=(in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
  }
  sVar3 = std::
          map<mir::inst::VarId,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>_>_>
          ::count((map<mir::inst::VarId,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>_>_>
                   *)in_stack_fffffffffffffe70,in_stack_fffffffffffffe68);
  if (sVar3 == 0) {
    local_28 = 0;
    uStack_20 = 0;
    local_38 = 0;
    uStack_30 = 0;
    local_48.super_Displayable._vptr_Displayable = (_func_int **)0x0;
    local_48.id = 0;
    local_48._12_4_ = 0;
    std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>::set
              ((set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
                *)0x1b3b06);
    std::
    map<mir::inst::VarId,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>_>_>
    ::operator[](in_RDI,in_RDX);
    in_stack_fffffffffffffe78 = &local_48;
    std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>::
    operator=((set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
               *)in_stack_fffffffffffffe60,
              (set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
               *)in_stack_fffffffffffffe58);
    std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>::~set
              ((set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
                *)0x1b3b3d);
    local_68 = 0;
    uStack_60 = 0;
    local_78 = 0;
    uStack_70 = 0;
    local_88 = 0;
    uStack_80 = 0;
    std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>::set
              ((set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
                *)0x1b3b65);
    in_stack_fffffffffffffe80 =
         std::
         map<mir::inst::VarId,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>_>_>
         ::operator[](in_RDI,in_RDX);
    std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>::
    operator=((set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
               *)in_stack_fffffffffffffe60,
              (set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
               *)in_stack_fffffffffffffe58);
    std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>::~set
              ((set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
                *)0x1b3b9e);
  }
  local_98[0]._M_node =
       (_Base_ptr)
       std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>::
       begin((set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
              *)in_stack_fffffffffffffe58);
  local_a0._M_node =
       (_Base_ptr)
       std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>::
       end((set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_> *)
           in_stack_fffffffffffffe58);
  while (bVar1 = std::operator!=(local_98,&local_a0), bVar1) {
    std::_Rb_tree_const_iterator<mir::inst::VarId>::operator*
              ((_Rb_tree_const_iterator<mir::inst::VarId> *)0x1b3c4e);
    mir::inst::VarId::VarId(in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
    sVar2 = std::
            map<mir::inst::VarId,_mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_mir::inst::VarId>_>_>
            ::count((map<mir::inst::VarId,_mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_mir::inst::VarId>_>_>
                     *)in_stack_fffffffffffffe70,in_stack_fffffffffffffe68);
    if (sVar2 != 0) {
      std::
      map<mir::inst::VarId,_mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_mir::inst::VarId>_>_>
      ::at((map<mir::inst::VarId,_mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_mir::inst::VarId>_>_>
            *)in_stack_fffffffffffffe80,in_stack_fffffffffffffe78);
      mir::inst::VarId::operator=(in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
    }
    if (((in_RSI->id == 0x1020b) && (local_b0.id == 0x1020d)) ||
       ((local_b0.id == 0x1020b && (in_RSI->id == 0x1020d)))) {
      this_00 = std::operator<<((ostream *)&std::cout,"find it ");
      std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
    }
    bVar1 = mir::inst::VarId::operator==(in_RSI,&local_b0);
    if (!bVar1) {
      sVar3 = std::
              map<mir::inst::VarId,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>_>_>
              ::count((map<mir::inst::VarId,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>_>_>
                       *)in_stack_fffffffffffffe70,in_stack_fffffffffffffe68);
      if (sVar3 == 0) {
        local_c8 = 0;
        uStack_c0 = 0;
        local_d8 = 0;
        uStack_d0 = 0;
        local_e8.super_Displayable._vptr_Displayable = (_func_int **)0x0;
        local_e8.id = 0;
        local_e8._12_4_ = 0;
        std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>::
        set((set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_> *
            )0x1b3d59);
        in_stack_fffffffffffffe70 =
             std::
             map<mir::inst::VarId,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>_>_>
             ::operator[](in_RDI,in_RDX);
        in_stack_fffffffffffffe60 = &local_e8;
        std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>::
        operator=((set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
                   *)in_stack_fffffffffffffe60,
                  (set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
                   *)in_stack_fffffffffffffe58);
        std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>::
        ~set((set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
              *)0x1b3d93);
        std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>::
        set((set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_> *
            )0x1b3dbb);
        in_stack_fffffffffffffe68 =
             (key_type *)
             std::
             map<mir::inst::VarId,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>_>_>
             ::operator[](in_RDI,in_RDX);
        std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>::
        operator=((set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
                   *)in_stack_fffffffffffffe60,
                  (set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
                   *)in_stack_fffffffffffffe58);
        std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>::
        ~set((set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
              *)0x1b3df7);
      }
      std::
      map<mir::inst::VarId,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>_>_>
      ::operator[](in_RDI,in_RDX);
      std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>::
      insert(in_stack_fffffffffffffe80,in_stack_fffffffffffffe78);
      std::
      map<mir::inst::VarId,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>_>_>
      ::operator[](in_RDI,in_RDX);
      std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>::
      insert(in_stack_fffffffffffffe80,in_stack_fffffffffffffe78);
      std::
      map<mir::inst::VarId,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>_>_>
      ::operator[](in_RDI,in_RDX);
      std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>::
      insert(in_stack_fffffffffffffe80,in_stack_fffffffffffffe78);
      std::
      map<mir::inst::VarId,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>_>_>
      ::operator[](in_RDI,in_RDX);
      std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>::
      insert(in_stack_fffffffffffffe80,in_stack_fffffffffffffe78);
    }
    std::_Rb_tree_const_iterator<mir::inst::VarId>::operator++
              ((_Rb_tree_const_iterator<mir::inst::VarId> *)in_stack_fffffffffffffe60);
  }
  return;
}

Assistant:

void add_conflict(mir::inst::VarId defVar,
                    std::set<mir::inst::VarId> useVars) {
    if (merged_var_Map.count(defVar)) {
      defVar = merged_var_Map.at(defVar);
    }
    if (!static_Map.count(defVar)) {
      static_Map[defVar] = std::set<mir::inst::VarId>();
      dynamic_Map[defVar] = std::set<mir::inst::VarId>();
    }
    for (auto useVar : useVars) {
      if (merged_var_Map.count(useVar)) {
        useVar = merged_var_Map.at(useVar);
      }
      if (defVar.id == 66059 && useVar.id == 66061 ||
          useVar.id == 66059 && defVar.id == 66061) {
        std::cout << "find it " << std::endl;
      }
      if (defVar == useVar) {
        continue;
      }
      if (!static_Map.count(useVar)) {
        static_Map[useVar] = std::set<mir::inst::VarId>();
        dynamic_Map[useVar] = std::set<mir::inst::VarId>();
      }
      static_Map[defVar].insert(useVar);
      static_Map[useVar].insert(defVar);
      dynamic_Map[defVar].insert(useVar);
      dynamic_Map[useVar].insert(defVar);
    }
  }